

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

void __thiscall QFile::QFile(QFile *this,QString *name)

{
  QFilePrivate *this_00;
  QString *in_RDI;
  QFilePrivate *d;
  QFileDevicePrivate *in_stack_ffffffffffffffd8;
  QFileDevice *in_stack_ffffffffffffffe0;
  
  this_00 = (QFilePrivate *)operator_new(0x1c0);
  QFilePrivate::QFilePrivate(this_00);
  QFileDevice::QFileDevice(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(QObject *)this_00);
  (in_RDI->d).d = (Data *)&PTR_metaObject_00be2908;
  d_func((QFile *)0x2a2a40);
  QString::operator=((QString *)this_00,in_RDI);
  return;
}

Assistant:

QFile::QFile(const QString &name)
    : QFileDevice(*new QFilePrivate, nullptr)
{
    Q_D(QFile);
    d->fileName = name;
}